

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adbc.cpp
# Opt level: O0

void __thiscall duckdb::ADBCTestDatabase::~ADBCTestDatabase(ADBCTestDatabase *this)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  AdbcStatusCode AVar1;
  ExprLhs<bool> EVar2;
  size_type in_RDI;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_fffffffffffffeb8;
  Flags in_stack_fffffffffffffebc;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  StringRef *in_stack_fffffffffffffec8;
  SourceLineInfo *this_00;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  SourceLineInfo *this_01;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  AssertionHandler *in_stack_fffffffffffffef0;
  SourceLineInfo local_100;
  StringRef local_f0;
  undefined1 local_81;
  SourceLineInfo local_70;
  StringRef local_60;
  
  if (*(long *)(in_RDI + 0x68) != 0) {
    (**(code **)(in_RDI + 0x68))(in_RDI + 0x50);
    *(undefined8 *)(in_RDI + 0x68) = 0;
  }
  local_60 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_fffffffffffffec7,
                                         CONCAT16(in_stack_fffffffffffffec6,
                                                  in_stack_fffffffffffffec0)),
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  this_01 = &local_70;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/adbc/test_adbc.cpp"
             ,0x33);
  Catch::StringRef::StringRef
            ((StringRef *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             (char *)in_stack_fffffffffffffec8);
  capturedExpression.m_size = in_RDI;
  capturedExpression.m_start = (char *)this_01;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             in_stack_fffffffffffffec8,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
             capturedExpression,in_stack_fffffffffffffebc);
  AVar1 = AdbcConnectionRelease(in_RDI + 0x40);
  SUCCESS(AVar1);
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     false);
  local_81 = EVar2;
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffef0,
             (ExprLhs<bool> *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
  local_f0 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_fffffffffffffec7,
                                         CONCAT16(in_stack_fffffffffffffec6,
                                                  in_stack_fffffffffffffec0)),
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  this_00 = &local_100;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/adbc/test_adbc.cpp"
             ,0x34);
  Catch::StringRef::StringRef
            ((StringRef *)CONCAT17(AVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffed0)),
             (char *)this_00);
  capturedExpression_00.m_size = in_RDI;
  capturedExpression_00.m_start = (char *)this_01;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT17(AVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffed0)),
             (StringRef *)this_00,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
             capturedExpression_00,in_stack_fffffffffffffebc);
  AVar1 = AdbcDatabaseRelease(in_RDI + 0x30);
  SUCCESS(AVar1);
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffef0,
             (ExprLhs<bool> *)CONCAT17(EVar2.m_lhs,in_stack_fffffffffffffee8));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(AVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffec0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(AVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffec0)));
  std::__cxx11::string::~string((string *)(in_RDI + 0x78));
  return;
}

Assistant:

~ADBCTestDatabase() {
		if (arrow_stream.release) {
			arrow_stream.release(&arrow_stream);
			arrow_stream.release = nullptr;
		}
		REQUIRE(SUCCESS(AdbcConnectionRelease(&adbc_connection, &adbc_error)));
		REQUIRE(SUCCESS(AdbcDatabaseRelease(&adbc_database, &adbc_error)));
	}